

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

void Abc_NtkPrintLatchEquivClasses(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  void *__ptr_00;
  Abc_Obj_t *pAVar6;
  char *__s;
  size_t sVar7;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  char *temp_name;
  int i;
  int repr_idx;
  Abc_Obj_t *pNtkFlop;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pFlop;
  char *pReprName;
  char *pFlopName;
  int *p_irrelevant;
  char **pNames;
  int num_orig_latches;
  int header_dumped;
  Aig_Man_t *pAig_local;
  Abc_Ntk_t *pNtk_local;
  
  bVar2 = false;
  iVar3 = Abc_NtkLatchNum(pNtk);
  __ptr = malloc((long)iVar3 << 3);
  __ptr_00 = malloc((long)iVar3 << 2);
  for (temp_name._0_4_ = 0; iVar4 = Vec_PtrSize(pNtk->vBoxes), (int)temp_name < iVar4;
      temp_name._0_4_ = (int)temp_name + 1) {
    pAVar6 = Abc_NtkBox(pNtk,(int)temp_name);
    iVar4 = Abc_ObjIsLatch(pAVar6);
    if (iVar4 != 0) {
      pAVar6 = Abc_ObjFanout0(pAVar6);
      __s = Abc_ObjName(pAVar6);
      sVar7 = strlen(__s);
      pvVar8 = malloc(sVar7 + 1);
      *(void **)((long)__ptr + (long)(int)temp_name * 8) = pvVar8;
      strcpy(*(char **)((long)__ptr + (long)(int)temp_name * 8),__s);
    }
  }
  Aig_ManSetCioIds(pAig);
  temp_name._0_4_ = 0;
  do {
    iVar4 = Saig_ManRegNum(pAig);
    if (iVar4 <= (int)temp_name) {
      bVar2 = false;
      for (temp_name._0_4_ = 0; (int)temp_name < iVar3; temp_name._0_4_ = (int)temp_name + 1) {
        if (*(int *)((long)__ptr_00 + (long)(int)temp_name * 4) != 0) {
          if (!bVar2) {
            Abc_Print(1,"The following flops have been deemed irrelevant:\n");
            bVar2 = true;
          }
          Abc_Print(1,"%s ",*(undefined8 *)((long)__ptr + (long)(int)temp_name * 8));
        }
        if (*(long *)((long)__ptr + (long)(int)temp_name * 8) != 0) {
          free(*(void **)((long)__ptr + (long)(int)temp_name * 8));
          *(undefined8 *)((long)__ptr + (long)(int)temp_name * 8) = 0;
        }
      }
      if (bVar2) {
        Abc_Print(1,"\n");
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      return;
    }
    p = pAig->vCis;
    iVar4 = Saig_ManPiNum(pAig);
    pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p,(int)temp_name + iVar4);
    *(undefined4 *)((long)__ptr_00 + (long)(int)temp_name * 4) = 0;
    uVar1 = *(undefined8 *)((long)__ptr + (long)(int)temp_name * 8);
    pAVar9 = Aig_ObjRepr(pAig,pAVar9);
    if (pAVar9 != (Aig_Obj_t *)0x0) {
      if (!bVar2) {
        Abc_Print(1,"Here are the flop equivalences:\n");
        bVar2 = true;
      }
      iVar4 = Aig_ObjIsConst1(pAVar9);
      if (iVar4 == 0) {
        iVar4 = Saig_ObjIsLo(pAig,pAVar9);
        if (iVar4 == 0) {
          __assert_fail("Saig_ObjIsLo( pAig, pRepr )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                        ,0x863,"void Abc_NtkPrintLatchEquivClasses(Abc_Ntk_t *, Aig_Man_t *)");
        }
        iVar4 = Aig_ObjCioId(pAVar9);
        iVar5 = Saig_ManPiNum(pAig);
        Abc_Print(1,"Original flop %s is proved equivalent to flop %s.\n",uVar1,
                  *(undefined8 *)((long)__ptr + (long)(iVar4 - iVar5) * 8));
      }
      else {
        Abc_Print(1,"Original flop %s is proved equivalent to constant.\n",uVar1);
      }
    }
    temp_name._0_4_ = (int)temp_name + 1;
  } while( true );
}

Assistant:

void Abc_NtkPrintLatchEquivClasses( Abc_Ntk_t * pNtk, Aig_Man_t * pAig )
{
    int header_dumped = 0;
    int num_orig_latches = Abc_NtkLatchNum(pNtk);
    char **pNames = ABC_ALLOC( char *, num_orig_latches );
    int *p_irrelevant = ABC_ALLOC( int, num_orig_latches );
    char * pFlopName, * pReprName;
    Aig_Obj_t * pFlop, * pRepr;
    Abc_Obj_t * pNtkFlop; 
    int repr_idx;
    int i;

    Abc_NtkForEachLatch( pNtk, pNtkFlop, i )
    {
        char *temp_name = Abc_ObjName( Abc_ObjFanout0(pNtkFlop) );
        pNames[i] = ABC_ALLOC( char , strlen(temp_name)+1);
        strcpy(pNames[i], temp_name);
    }
    i = 0;
    
    Aig_ManSetCioIds( pAig );
    Saig_ManForEachLo( pAig, pFlop, i )
    {
        p_irrelevant[i] = false;
        
        pFlopName = pNames[i];

        pRepr = Aig_ObjRepr(pAig, pFlop);

        if ( pRepr == NULL )
        {
            // Abc_Print( 1, "Nothing equivalent to flop %s\n", pFlopName);
//            p_irrelevant[i] = true;
            continue;
        }

        if (!header_dumped)
        {
            Abc_Print( 1, "Here are the flop equivalences:\n");
            header_dumped = true;
        }

        // pRepr is representative of the equivalence class, to which pFlop belongs
        if ( Aig_ObjIsConst1(pRepr) )
        {
            Abc_Print( 1, "Original flop %s is proved equivalent to constant.\n", pFlopName );
            // Abc_Print( 1, "Original flop # %d is proved equivalent to constant.\n", i );
            continue;
        }

        assert( Saig_ObjIsLo( pAig, pRepr ) );
        repr_idx = Aig_ObjCioId(pRepr) - Saig_ManPiNum(pAig);
        pReprName = pNames[repr_idx];
        Abc_Print( 1, "Original flop %s is proved equivalent to flop %s.\n",  pFlopName, pReprName );
        // Abc_Print( 1, "Original flop # %d is proved equivalent to flop # %d.\n",  i, repr_idx );
    }

    header_dumped = false;
    for (i=0; i<num_orig_latches; ++i)
    {
        if (p_irrelevant[i])
        {
            if (!header_dumped)
            {
                Abc_Print( 1, "The following flops have been deemed irrelevant:\n");
                header_dumped = true;
            }
            Abc_Print( 1, "%s ", pNames[i]);
        }
        
        ABC_FREE(pNames[i]);
    }
    if (header_dumped)
        Abc_Print( 1, "\n");
    
    ABC_FREE(pNames);
    ABC_FREE(p_irrelevant);
}